

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_coding.cc
# Opt level: O2

void anon_unknown.dwarf_ba46::Free(Node *node)

{
  if (node != (Node *)0x0) {
    Free(node->left_);
    Free(node->right_);
    (*node->_vptr_Node[1])(node);
    return;
  }
  return;
}

Assistant:

void Free(const Node* node) {
  if (NULL == node) return;
  Free(node->GetLeft());
  Free(node->GetRight());
  delete node;
}